

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxRandom::Emit(FxRandom *this,VMFunctionBuilder *build)

{
  VMFunction *pVVar1;
  bool bVar2;
  int iVar3;
  int opcode_00;
  ExpEmit local_3c;
  FName local_34;
  int opcode;
  PSymbol *sym;
  VMFunction *callfunc;
  VMFunctionBuilder *build_local;
  FxRandom *this_local;
  ExpEmit out;
  
  callfunc = (VMFunction *)build;
  build_local = (VMFunctionBuilder *)this;
  FName::FName(&local_34,NAME_DecoRandom);
  _opcode = &FindDecorateBuiltinFunction(&local_34,DecoRandom)->super_DObject;
  bVar2 = DObject::IsKindOf(_opcode,PSymbolVMFunction::RegistrationInfo.MyClass);
  pVVar1 = callfunc;
  if (!bVar2) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0xafd,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
  }
  if (_opcode[1]._vptr_DObject != (_func_int **)0x0) {
    sym = (PSymbol *)_opcode[1]._vptr_DObject;
    opcode_00 = 0x3c;
    if (((this->super_FxExpression).field_0x31 & 1) != 0) {
      opcode_00 = 0x3e;
    }
    iVar3 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,this->rng,'\t');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar1,0x39,0,7,iVar3);
    pVVar1 = callfunc;
    if ((this->min == (FxExpression *)0x0) || (this->max == (FxExpression *)0x0)) {
      iVar3 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,sym,'\x01');
      VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar1,opcode_00,iVar3,1,1);
    }
    else {
      EmitParameter((VMFunctionBuilder *)callfunc,this->min,
                    &(this->super_FxExpression).ScriptPosition);
      EmitParameter((VMFunctionBuilder *)callfunc,this->max,
                    &(this->super_FxExpression).ScriptPosition);
      pVVar1 = callfunc;
      iVar3 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,sym,'\x01');
      VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar1,opcode_00,iVar3,3,1);
    }
    if (((this->super_FxExpression).field_0x31 & 1) == 0) {
      ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5),(VMFunctionBuilder *)callfunc,0);
      VMFunctionBuilder::Emit((VMFunctionBuilder *)callfunc,0x3f,0,0,(uint)this_local._5_1_);
    }
    else {
      ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5));
      this_local._7_1_ = this_local._7_1_ & 0xfb | 4;
    }
    local_3c._2_1_ = this_local._7_1_;
    local_3c.RegNum = this_local._5_1_;
    local_3c.RegType = this_local._6_1_;
    return local_3c;
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0xafe,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom::Emit(VMFunctionBuilder *build)
{
	// Call DecoRandom to generate a random number.
	VMFunction *callfunc;
	PSymbol *sym = FindDecorateBuiltinFunction(NAME_DecoRandom, DecoRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != NULL);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != NULL && max != NULL)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}